

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O2

void __thiscall
Centaurus::MyConstPool::load_charclass_filter<char>
          (MyConstPool *this,X86Xmm *dest,CharClass<char> *cc)

{
  size_t offset;
  anon_union_16_7_ed616b9d_for_Operand__0 local_38;
  Data128 data;
  
  data = pack_charclass(cc);
  asmjit::ConstPool::add(&this->m_pool,&data,0x10,&offset);
  local_38._packed[0] = (UInt64)0xa;
  local_38._any.reserved12_4 = (this->m_label).super_Operand.super_Operand_.field_0._any.id;
  local_38._any.reserved8_4 = (uint32_t)offset;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)this->m_as,400,(Operand_ *)dest,(Operand_ *)&local_38._any);
  return;
}

Assistant:

void load_charclass_filter(asmjit::X86Xmm dest, const CharClass<TCHAR>& cc)
    {
        asmjit::Data128 data = pack_charclass(cc);

        size_t offset;
        m_pool.add(&data, 16, offset);

        m_as.movdqa(dest, asmjit::X86Mem(m_label, offset));
    }